

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.hpp
# Opt level: O2

bool LoaderLogger::LogErrorMessage
               (string *command_name,string *message,
               vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *objects)

{
  bool bVar1;
  LoaderLogger *this;
  allocator local_49;
  string local_48;
  
  this = GetInstance();
  std::__cxx11::string::string((string *)&local_48,"OpenXR-Loader",&local_49);
  bVar1 = LogMessage(this,0x1000,1,&local_48,command_name,message,objects);
  std::__cxx11::string::~string((string *)&local_48);
  return bVar1;
}

Assistant:

static bool LogErrorMessage(const std::string& command_name, const std::string& message,
                                const std::vector<XrSdkLogObjectInfo>& objects = {}) {
        return GetInstance().LogMessage(XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT, XR_LOADER_LOG_MESSAGE_TYPE_GENERAL_BIT,
                                        "OpenXR-Loader", command_name, message, objects);
    }